

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O1

void test_assignment_out(void)

{
  size_t __size;
  void *__ptr;
  runtime_error *this;
  int connections [8];
  float score_graph [16];
  int local_78;
  int local_74;
  int local_70;
  float local_58 [18];
  
  __size = trt_pose::parse::assignment_out_workspace(4);
  __ptr = malloc(__size);
  local_58[0xc] = 0.0;
  local_58[0xd] = 0.0;
  local_58[0xe] = 0.0;
  local_58[0xf] = 0.0;
  local_58[8] = 4.0;
  local_58[9] = 3.0;
  local_58[10] = 4.0;
  local_58[0xb] = 0.0;
  local_58[4] = 1.0;
  local_58[5] = 2.0;
  local_58[6] = 1.0;
  local_58[7] = 0.0;
  local_58[0] = 1.0;
  local_58[1] = 3.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  trt_pose::parse::assignment_out(&local_78,local_58,3,3,4,0.3,__ptr);
  if (local_78 == 1) {
    if (local_74 == 0) {
      if (local_70 == 2) {
        free(__ptr);
        return;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"connections[0] should be 1.");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"connections[0] should be 1.");
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"connections[0] should be 1.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_assignment_out()
{
  const int M = 4;
  const int count_a = 3;
  const int count_b = 3;
  const float score_threshold = 0.3;
  
  std::size_t workspace_size = assignment_out_workspace(M);
  void *workspace = (void *) malloc(workspace_size);

  int connections[2 * M];
  const float score_graph[M * M] = {
    1., 3., 0., 0.,
    1., 2., 1., 0.,
    4., 3., 4., 0.,
    0., 0., 0., 0.,
  };

  assignment_out(connections, score_graph, count_a, count_b, M, score_threshold, workspace);

  if (connections[0] != 1) {
    throw std::runtime_error("connections[0] should be 1.");
  }
  if (connections[1] != 0) {
    throw std::runtime_error("connections[0] should be 1.");
  }
  if (connections[2] != 2) {
    throw std::runtime_error("connections[0] should be 1.");
  }

  free(workspace);
}